

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteBuildEventsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccv,string *name,string *cmd)

{
  cmCustomCommand *pcVar1;
  pointer pbVar2;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  cmCustomCommand *cc;
  string *psVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *byp;
  pointer pbVar7;
  undefined8 uVar8;
  undefined6 in_stack_fffffffffffffaa8;
  char in_stack_fffffffffffffaae;
  char in_stack_fffffffffffffaaf;
  int iVar9;
  int in_stack_fffffffffffffab4;
  string fname;
  _Any_data local_4f8;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  string shell;
  string fext;
  cmAlphaNum local_490;
  string local_460;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  cmGeneratedFileStream f;
  cmCustomCommandGenerator ccg;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&fext,".sh",(allocator<char> *)&f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shell,"/bin/sh ",(allocator<char> *)&f);
  cc = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pcVar1 = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar9 = 0;
  while( true ) {
    if (cc == pcVar1) break;
    uVar8 = 0x3737f2;
    std::__cxx11::string::string((string *)&local_460,(string *)&this->ConfigName);
    local_440._M_engaged = false;
    local_4f8._M_unused._M_object = (void *)0x0;
    local_4f8._8_8_ = 0;
    local_4e8 = 0;
    uStack_4e0 = 0;
    computeInternalDepfile.super__Function_base._M_functor._8_8_ = uVar8;
    computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_4f8;
    computeInternalDepfile.super__Function_base._M_manager._0_6_ = in_stack_fffffffffffffaa8;
    computeInternalDepfile.super__Function_base._M_manager._6_1_ = in_stack_fffffffffffffaae;
    computeInternalDepfile.super__Function_base._M_manager._7_1_ = in_stack_fffffffffffffaaf;
    computeInternalDepfile._M_invoker._0_4_ = iVar9;
    computeInternalDepfile._M_invoker._4_4_ = in_stack_fffffffffffffab4;
    cmCustomCommandGenerator::cmCustomCommandGenerator
              (&ccg,cc,&local_460,&this->LocalGenerator->super_cmLocalGenerator,true,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_440,computeInternalDepfile);
    std::_Function_base::~_Function_base((_Function_base *)&local_4f8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       (&this->LocalGenerator->super_cmLocalGenerator);
    f.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (psVar3->_M_dataplus)._M_p;
    f.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)psVar3->_M_string_length;
    local_490.View_._M_len = 1;
    local_490.View_._M_str = local_490.Digits_;
    local_490.Digits_[0] = '/';
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
              (&local_418,this->LocalGenerator,this->GeneratorTarget);
    in_stack_fffffffffffffaaf = '/';
    in_stack_fffffffffffffaae = '_';
    in_stack_fffffffffffffab4 = iVar9;
    cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char,std::__cxx11::string,int,std::__cxx11::string>
              (&fname,(cmAlphaNum *)&f,&local_490,&local_418,&stack0xfffffffffffffaaf,&this->Name,
               &stack0xfffffffffffffaae,name,(int *)&stack0xfffffffffffffab4,&fext);
    std::__cxx11::string::~string((string *)&local_418);
    cmGeneratedFileStream::cmGeneratedFileStream(&f,&fname,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent(&f,true);
    WriteCustomCommandsHelper(this,(ostream *)&f,&ccg);
    cmGeneratedFileStream::Close(&f);
    if (this->TagType == CUSTOM_TARGET) {
      poVar4 = std::operator<<(fout,(string *)&fname);
      poVar4 = std::operator<<(poVar4,"\n    :outputName=\"");
      poVar4 = std::operator<<(poVar4,(string *)&fname);
      pcVar6 = ".rule\"\n";
    }
    else {
      poVar4 = std::operator<<(fout,"    :");
      poVar4 = std::operator<<(poVar4,(string *)cmd);
      poVar4 = std::operator<<(poVar4,"=\"");
      poVar4 = std::operator<<(poVar4,(string *)&shell);
      poVar4 = std::operator<<(poVar4,(string *)&fname);
      pcVar6 = "\"\n";
    }
    std::operator<<(poVar4,pcVar6);
    pvVar5 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
    iVar9 = iVar9 + 1;
    pbVar2 = (pvVar5->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (pvVar5->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1)
    {
      poVar4 = std::operator<<(fout,"    :extraOutputFile=\"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar7);
      std::operator<<(poVar4,"\"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&f);
    std::__cxx11::string::~string((string *)&fname);
    cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
    cc = cc + 1;
  }
  std::__cxx11::string::~string((string *)&shell);
  std::__cxx11::string::~string((string *)&fext);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteBuildEventsHelper(
  std::ostream& fout, const std::vector<cmCustomCommand>& ccv,
  std::string const& name, std::string const& cmd)
{
  int cmdcount = 0;
#ifdef _WIN32
  std::string fext = ".bat";
  std::string shell;
#else
  std::string fext = ".sh";
  std::string shell = "/bin/sh ";
#endif

  for (cmCustomCommand const& cc : ccv) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this->LocalGenerator);
    // Open the filestream for this custom command
    std::string fname =
      cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
               this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
               '/', this->Name, '_', name, cmdcount++, fext);

    cmGeneratedFileStream f(fname);
    f.SetCopyIfDifferent(true);
    this->WriteCustomCommandsHelper(f, ccg);
    f.Close();
    if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
      fout << "    :" << cmd << "=\"" << shell << fname << "\"\n";
    } else {
      fout << fname << "\n    :outputName=\"" << fname << ".rule\"\n";
    }
    for (const auto& byp : ccg.GetByproducts()) {
      fout << "    :extraOutputFile=\"" << byp << "\"\n";
    }
  }
}